

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O0

void __thiscall HttpTestListener::HttpTestListener(HttpTestListener *this,int port)

{
  http_parser *phVar1;
  int port_local;
  HttpTestListener *this_local;
  
  std::__cxx11::string::string((string *)&this->request_url_);
  std::__cxx11::string::string((string *)&this->request_body_);
  std::__cxx11::string::string((string *)&this->response_body_);
  std::__cxx11::string::string((string *)&this->request_method_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map_request_query_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map_request_header_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map_response_header_);
  std::__cxx11::string::string((string *)&this->last_request_field_);
  std::__cxx11::string::string((string *)&this->last_request_value_);
  this->response_status_code_ = 200;
  this->is_request_complete_ = false;
  this->is_last_value_ = false;
  this->local_port_ = port;
  phVar1 = (http_parser *)calloc(1,0x20);
  this->parser_ = phVar1;
  return;
}

Assistant:

HttpTestListener::HttpTestListener(int port) {
  response_status_code_ = 200;
  is_request_complete_ = false;
  is_last_value_ = false;
  this->local_port_ = port;
  this->parser_ = (http_parser*)calloc(1, sizeof(http_parser));
}